

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O0

int testSpanTestsSlicingBounded(void)

{
  initializer_list<int> __l;
  size_t sVar1;
  ostream *poVar2;
  reference piVar3;
  size_t sVar4;
  pointer ptVar5;
  pointer ptVar6;
  Span<int,_18446744073709551615UL> SVar7;
  undefined1 local_b8 [8];
  Span<int,_18446744073709551615UL> sub_2;
  Span<int,_18446744073709551615UL> sub_1;
  Span<int,_18446744073709551615UL> subsub;
  undefined1 local_80 [8];
  Span<int,_18446744073709551615UL> sub;
  Span<int,_18446744073709551615UL> span;
  allocator<int> local_49;
  int local_48 [4];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> values;
  
  local_48[0] = 1;
  local_48[1] = 2;
  local_48[2] = 3;
  local_48[3] = 4;
  local_38 = local_48;
  local_30 = 4;
  std::allocator<int>::allocator(&local_49);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l,&local_49);
  std::allocator<int>::~allocator(&local_49);
  SVar7 = MILBlob::Util::MakeSpan<int,_std::vector,_std::allocator<int>_>
                    ((vector<int,_std::allocator<int>_> *)local_28);
  sub.m_size.m_size = (size_t)SVar7.m_ptr;
  SVar7 = MILBlob::Util::Span<int,_18446744073709551615UL>::Slice
                    ((Span<int,_18446744073709551615UL> *)&sub.m_size,1,2);
  sub.m_ptr = (pointer)SVar7.m_size.m_size;
  local_80 = (undefined1  [8])SVar7.m_ptr;
  sVar1 = MILBlob::Util::Span<int,_18446744073709551615UL>::Size
                    ((Span<int,_18446744073709551615UL> *)local_80);
  if (sVar1 == 2) {
    piVar3 = MILBlob::Util::Span<int,_18446744073709551615UL>::operator[]
                       ((Span<int,_18446744073709551615UL> *)local_80,0);
    if (*piVar3 == 2) {
      piVar3 = MILBlob::Util::Span<int,_18446744073709551615UL>::operator[]
                         ((Span<int,_18446744073709551615UL> *)local_80,1);
      if (*piVar3 == 3) {
        SVar7 = MILBlob::Util::Span<int,_18446744073709551615UL>::Slice
                          ((Span<int,_18446744073709551615UL> *)local_80,0,1);
        sub_1.m_size.m_size = (size_t)SVar7.m_ptr;
        sVar1 = MILBlob::Util::Span<int,_18446744073709551615UL>::Size
                          ((Span<int,_18446744073709551615UL> *)&sub_1.m_size);
        if (sVar1 == 1) {
          piVar3 = MILBlob::Util::Span<int,_18446744073709551615UL>::operator[]
                             ((Span<int,_18446744073709551615UL> *)&sub_1.m_size,0);
          if (*piVar3 == 2) {
            SVar7 = MILBlob::Util::Span<int,_18446744073709551615UL>::Slice
                              ((Span<int,_18446744073709551615UL> *)&sub.m_size,3,1);
            sub_1.m_ptr = (pointer)SVar7.m_size.m_size;
            sub_2.m_size.m_size = (size_t)SVar7.m_ptr;
            sVar1 = MILBlob::Util::Span<int,_18446744073709551615UL>::Size
                              ((Span<int,_18446744073709551615UL> *)&sub_2.m_size);
            if (sVar1 == 1) {
              piVar3 = MILBlob::Util::Span<int,_18446744073709551615UL>::operator[]
                                 ((Span<int,_18446744073709551615UL> *)&sub_2.m_size,0);
              if (*piVar3 == 4) {
                sVar1 = MILBlob::Util::Span<int,_18446744073709551615UL>::Size
                                  ((Span<int,_18446744073709551615UL> *)&sub.m_size);
                SVar7 = MILBlob::Util::Span<int,_18446744073709551615UL>::Slice
                                  ((Span<int,_18446744073709551615UL> *)&sub.m_size,0,sVar1);
                sub_2.m_ptr = (pointer)SVar7.m_size.m_size;
                local_b8 = (undefined1  [8])SVar7.m_ptr;
                sVar1 = MILBlob::Util::Span<int,_18446744073709551615UL>::Size
                                  ((Span<int,_18446744073709551615UL> *)local_b8);
                sVar4 = MILBlob::Util::Span<int,_18446744073709551615UL>::Size
                                  ((Span<int,_18446744073709551615UL> *)&sub.m_size);
                if (sVar1 == sVar4) {
                  ptVar5 = MILBlob::Util::Span<int,_18446744073709551615UL>::Data
                                     ((Span<int,_18446744073709551615UL> *)local_b8);
                  ptVar6 = MILBlob::Util::Span<int,_18446744073709551615UL>::Data
                                     ((Span<int,_18446744073709551615UL> *)&sub.m_size);
                  if (ptVar5 == ptVar6) {
                    values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                  }
                  else {
                    poVar2 = std::operator<<((ostream *)&std::cout,
                                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                                            );
                    poVar2 = std::operator<<(poVar2,":");
                    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x20e);
                    poVar2 = std::operator<<(poVar2,": error: ");
                    poVar2 = std::operator<<(poVar2,"(sub.Data()) == (span.Data())");
                    poVar2 = std::operator<<(poVar2," was false, expected true.");
                    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                    values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
                  }
                }
                else {
                  poVar2 = std::operator<<((ostream *)&std::cout,
                                           "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                                          );
                  poVar2 = std::operator<<(poVar2,":");
                  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x20d);
                  poVar2 = std::operator<<(poVar2,": error: ");
                  poVar2 = std::operator<<(poVar2,"(sub.Size()) == (span.Size())");
                  poVar2 = std::operator<<(poVar2," was false, expected true.");
                  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                  values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
                }
              }
              else {
                poVar2 = std::operator<<((ostream *)&std::cout,
                                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                                        );
                poVar2 = std::operator<<(poVar2,":");
                poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x208);
                poVar2 = std::operator<<(poVar2,": error: ");
                poVar2 = std::operator<<(poVar2,"(sub[0]) == (4)");
                poVar2 = std::operator<<(poVar2," was false, expected true.");
                std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage._4_4_ = 1;
              }
            }
            else {
              poVar2 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                                      );
              poVar2 = std::operator<<(poVar2,":");
              poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x207);
              poVar2 = std::operator<<(poVar2,": error: ");
              poVar2 = std::operator<<(poVar2,"(sub.Size()) == (size_t(1))");
              poVar2 = std::operator<<(poVar2," was false, expected true.");
              std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
              values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_ = 1;
            }
          }
          else {
            poVar2 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                                    );
            poVar2 = std::operator<<(poVar2,":");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x202);
            poVar2 = std::operator<<(poVar2,": error: ");
            poVar2 = std::operator<<(poVar2,"(subsub[0]) == (2)");
            poVar2 = std::operator<<(poVar2," was false, expected true.");
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_ = 1;
          }
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                                  );
          poVar2 = std::operator<<(poVar2,":");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x201);
          poVar2 = std::operator<<(poVar2,": error: ");
          poVar2 = std::operator<<(poVar2,"(subsub.Size()) == (size_t(1))");
          poVar2 = std::operator<<(poVar2," was false, expected true.");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ = 1;
        }
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1fe);
        poVar2 = std::operator<<(poVar2,": error: ");
        poVar2 = std::operator<<(poVar2,"(sub[1]) == (3)");
        poVar2 = std::operator<<(poVar2," was false, expected true.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = 1;
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1fd);
      poVar2 = std::operator<<(poVar2,": error: ");
      poVar2 = std::operator<<(poVar2,"(sub[0]) == (2)");
      poVar2 = std::operator<<(poVar2," was false, expected true.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 1;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1fc);
    poVar2 = std::operator<<(poVar2,": error: ");
    poVar2 = std::operator<<(poVar2,"(sub.Size()) == (size_t(2))");
    poVar2 = std::operator<<(poVar2," was false, expected true.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

int testSpanTestsSlicingBounded()
{
    std::vector<int> values = {1, 2, 3, 4};
    auto span = MakeSpan(values);

    {
        auto sub = span.Slice(1, 2);
        ML_ASSERT_EQ(sub.Size(), size_t(2));
        ML_ASSERT_EQ(sub[0], 2);
        ML_ASSERT_EQ(sub[1], 3);

        auto subsub = sub.Slice(0, 1);
        ML_ASSERT_EQ(subsub.Size(), size_t(1));
        ML_ASSERT_EQ(subsub[0], 2);
    }

    {
        auto sub = span.Slice(3, 1);
        ML_ASSERT_EQ(sub.Size(), size_t(1));
        ML_ASSERT_EQ(sub[0], 4);
    }

    {
        auto sub = span.Slice(0, span.Size());
        ML_ASSERT_EQ(sub.Size(), span.Size());
        ML_ASSERT_EQ(sub.Data(), span.Data());
    }

    return 0;
}